

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

lest * __thiscall lest::make_strg_string(lest *this,string *txt)

{
  lest local_78 [32];
  string local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [32];
  string *local_18;
  string *txt_local;
  
  local_18 = txt;
  txt_local = (string *)this;
  make_tran_string(local_78,txt);
  std::operator+((char *)local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1fdf3b);
  std::operator+(local_38,(char *)local_58);
  std::__cxx11::string::string((string *)this,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string((string *)local_78);
  return this;
}

Assistant:

inline std::string make_strg_string( std::string const & txt ) { return "\"" + make_tran_string(                 txt   ) + "\"" ; }